

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O0

vm_obj_id_t CVmDynamicFunc::create_from_stack(uchar **pc_ptr,uint argc)

{
  vm_obj_id_t vVar1;
  vm_val_t *pvVar2;
  uint in_ESI;
  vm_obj_id_t id;
  vm_obj_id_t macros;
  vm_obj_id_t locals;
  vm_obj_id_t globals;
  vm_val_t *src;
  
  if ((in_ESI != 0) && (in_ESI < 5)) {
    CVmStack::get(0);
    if (1 < in_ESI) {
      pvVar2 = CVmStack::get(1);
      if (pvVar2->typ == VM_OBJ) {
        CVmStack::get(1);
      }
      else {
        pvVar2 = CVmStack::get(1);
        if (pvVar2->typ != VM_NIL) {
          err_throw(0);
        }
      }
    }
    if (2 < in_ESI) {
      pvVar2 = CVmStack::get(2);
      if (pvVar2->typ == VM_OBJ) {
        CVmStack::get(2);
      }
      else {
        pvVar2 = CVmStack::get(2);
        if (pvVar2->typ != VM_NIL) {
          err_throw(0);
        }
      }
    }
    if (3 < in_ESI) {
      pvVar2 = CVmStack::get(3);
      if (pvVar2->typ == VM_OBJ) {
        CVmStack::get(3);
      }
      else {
        pvVar2 = CVmStack::get(3);
        if (pvVar2->typ != VM_NIL) {
          err_throw(0);
        }
      }
    }
    vVar1 = create(src._4_4_,(vm_obj_id_t)src,globals,locals,_id);
    CVmStack::discard(in_ESI);
    return vVar1;
  }
  err_throw(0);
}

Assistant:

vm_obj_id_t CVmDynamicFunc::create_from_stack(
    VMG_ const uchar **pc_ptr, uint argc)
{
    /* check arguments */
    if (argc < 1 || argc > 4)
        err_throw(VMERR_WRONG_NUM_OF_ARGS);

    /* get the source code argument (leave on stack for gc protection) */
    const vm_val_t *src = G_stk->get(0);

    /* get the global symbol table object, if any */
    vm_obj_id_t globals = VM_INVALID_OBJ;
    if (argc >= 2)
    {
        /* it has to be an object or nil */
        if (G_stk->get(1)->typ == VM_OBJ)
            globals = G_stk->get(1)->val.obj;
        else if (G_stk->get(1)->typ != VM_NIL)
            err_throw(VMERR_BAD_TYPE_BIF);
    }

    /* get the local symbol table object, if any */
    vm_obj_id_t locals = VM_INVALID_OBJ;
    if (argc >= 3)
    {
        /* it has to be an object or nil */
        if (G_stk->get(2)->typ == VM_OBJ)
            locals = G_stk->get(2)->val.obj;
        else if (G_stk->get(2)->typ != VM_NIL)
            err_throw(VMERR_BAD_TYPE_BIF);
    }

    /* check for macros */
    vm_obj_id_t macros = VM_INVALID_OBJ;
    if (argc >= 4)
    {
        /* it has to be an object or nil */
        if (G_stk->get(3)->typ == VM_OBJ)
            macros = G_stk->get(3)->val.obj;
        else if (G_stk->get(3)->typ != VM_NIL)
            err_throw(VMERR_BAD_TYPE_BIF);
    }

    /* allocate the object ID and create the object */
    vm_obj_id_t id = create(vmg_ FALSE, globals, locals, macros, src);

    /* discard arguments */
    G_stk->discard(argc);

    /* return the new ID */
    return id;
}